

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv,char **envp)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_80 [8];
  string ARCH;
  string OS;
  string ENV;
  char **envp_local;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string((string *)(OS.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(ARCH.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_80);
  if ((isWindows & 1U) == 0) {
    pcVar3 = getenv("OSTYPE");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d0,pcVar3,&local_d1);
    iVar2 = std::__cxx11::string::compare((char *)local_d0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
    if (iVar2 == 0) {
      pcVar3 = getenv("MACHTYPE");
      std::__cxx11::string::operator=((string *)(OS.field_2._M_local_buf + 8),pcVar3);
    }
    else {
      pcVar3 = getenv("TERM_PROGRAM");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_f8,pcVar3,&local_f9);
      iVar2 = std::__cxx11::string::compare((char *)local_f8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator(&local_f9);
      if (iVar2 == 0) {
        std::__cxx11::string::operator=
                  ((string *)(OS.field_2._M_local_buf + 8),"macOS/Mac OSX, x86-64/x64");
      }
      else {
        pcVar3 = getenv("OSTYPE");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_120,pcVar3,&local_121);
        iVar2 = std::__cxx11::string::compare((char *)local_120);
        std::__cxx11::string::~string(local_120);
        std::allocator<char>::~allocator(&local_121);
        if (iVar2 == 0) {
          pcVar3 = getenv("MACHTYPE");
          std::__cxx11::string::operator=((string *)(OS.field_2._M_local_buf + 8),pcVar3);
        }
        else {
          std::__cxx11::string::operator=((string *)(OS.field_2._M_local_buf + 8),"Unknown");
        }
      }
    }
  }
  else {
    pcVar3 = getenv("OS");
    std::__cxx11::string::operator=((string *)(ARCH.field_2._M_local_buf + 8),pcVar3);
    pcVar3 = getenv("PROCESSOR_ARCHITECTURE");
    std::__cxx11::string::operator=((string *)local_80,pcVar3);
    std::operator+(&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&ARCH.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    std::__cxx11::string::operator=((string *)(OS.field_2._M_local_buf + 8),(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "\nNew Language Features & Language Changes in C++17 (http://bit.ly/Cplusplus17Ft) ~ Adrian D."
                          );
  std::ostream::operator<<((ostream *)poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "Enter \'exit\' at anytime to terminate the application.");
  std::ostream::operator<<((ostream *)poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Env. ");
  poVar4 = std::operator<<(poVar4,(string *)(OS.field_2._M_local_buf + 8));
  std::ostream::operator<<((ostream *)poVar4,std::endl<char,std::char_traits<char>>);
  do {
    bVar1 = displayFtTypePrompt();
  } while (!bVar1);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)(ARCH.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(OS.field_2._M_local_buf + 8));
  return 0;
}

Assistant:

int main (int argc, char* argv[], char* envp[]) {

	//ENV
	string ENV, OS, ARCH;

	//Windows
	if (isWindows) {
		OS = getenv("OS");
		ARCH = getenv("PROCESSOR_ARCHITECTURE");
		ENV = OS + ARCH;
	}
	//Linux
	else if (string(getenv("OSTYPE")).compare("linux") == 0) {
		ENV = getenv("MACHTYPE");
	}
	//Mac
	else if (string(getenv("TERM_PROGRAM")).compare("Apple_Terminal") == 0) {
		ENV = "macOS/Mac OSX, x86-64/x64";
	}
	//BSD
	else if (string(getenv("OSTYPE")).compare("bsd") == 0) {
		ENV = getenv("MACHTYPE");
	}
	//Unknown
	else
		ENV = "Unknown";

	//Prompt
	cout << "\nNew Language Features & Language Changes in C++17 (http://bit.ly/Cplusplus17Ft) ~ Adrian D." << endl;
	cout << "Enter 'exit' at anytime to terminate the application." << endl;
	cout << "Env. " << ENV << endl;
	
	//Display Prompts
	while (true) {
		if (displayFtTypePrompt())
			break;
	}

	return 0;
}